

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_setLogCallbackTest_Test::TestBody
          (OpenDDLParserTest_setLogCallbackTest_Test *this)

{
  bool bVar1;
  _func_void_LogSeverity_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  **actual;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_100;
  _Any_data local_f8;
  long local_e8;
  AssertionResult gtest_ar;
  AssertHelper local_b8;
  OpenDDLParser myParser;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  logCallback local_30;
  
  OpenDDLParser::OpenDDLParser(&myParser);
  local_100.data_ = (AssertHelperData *)0x0;
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_f8,&myParser);
  testing::internal::
  CmpHelperEQ<decltype(nullptr),std::function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>>
            ((internal *)&gtest_ar,"nullptr","myParser.getLogCallback()",&local_100.data_,
             (function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_f8,&myParser);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,"",(allocator<char> *)&local_100);
    std::
    function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f8,ddl_info_msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  }
  testing::Message::Message((Message *)&local_f8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
             ,0x8b,
             "Expected: myParser.getLogCallback()(ddl_info_msg, \"\") throws an exception of type std::bad_function_call.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_f8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_f8);
  local_30.super__Function_base._M_functor._8_8_ = 0;
  local_30.super__Function_base._M_functor._M_unused._M_object = OpenDDLParserTest::testLogCallback;
  local_30._M_invoker =
       std::
       _Function_handler<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_invoke;
  local_30.super__Function_base._M_manager =
       std::
       _Function_handler<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_void_(*)(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       ::_M_manager;
  OpenDDLParser::setLogCallback(&myParser,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  local_100.data_ = (AssertHelperData *)OpenDDLParserTest::testLogCallback;
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_f8,&myParser);
  actual = __const_std__function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>__target<void(*)(ODDLParser::LogSeverity,std::__cxx11::string_const&)>__const_
                     (&local_f8);
  testing::internal::
  CmpHelperEQ<void(*)(ODDLParser::LogSeverity,std::__cxx11::string_const&),void(*)(ODDLParser::LogSeverity,std::__cxx11::string_const&)>
            ((internal *)&gtest_ar,"&OpenDDLParserTest::testLogCallback",
             "*myParser.getLogCallback().target<cbType>()",
             (_func_void_LogSeverity_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              **)&local_100,actual);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_100.data_ = (AssertHelperData *)0x0;
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_f8,&myParser);
  testing::internal::
  CmpHelperNE<decltype(nullptr),std::function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>>
            ((internal *)&gtest_ar,"nullptr","myParser.getLogCallback()",&local_100.data_,
             (function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_f8,&myParser);
  gtest_ar.success_ = local_e8 != 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_f8,(internal *)&gtest_ar,
               (AssertionResult *)"(bool)myParser.getLogCallback()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x91,(char *)local_f8._M_unused._0_8_);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)local_f8._M_pod_data);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  uStack_40 = 0;
  OpenDDLParser::setLogCallback(&myParser,(logCallback *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  local_100.data_ = (AssertHelperData *)0x0;
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_f8,&myParser);
  testing::internal::
  CmpHelperEQ<decltype(nullptr),std::function<void(ODDLParser::LogSeverity,std::__cxx11::string_const&)>>
            ((internal *)&gtest_ar,"nullptr","myParser.getLogCallback()",&local_100.data_,
             (function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_f8,&myParser);
  gtest_ar.success_ = local_e8 == 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_f8,(internal *)&gtest_ar,
               (AssertionResult *)"(bool)myParser.getLogCallback()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x95,(char *)local_f8._M_unused._0_8_);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)local_f8._M_pod_data);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    OpenDDLParser::getLogCallback_abi_cxx11_((logCallback *)&local_f8,&myParser);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar,"",(allocator<char> *)&local_100);
    std::
    function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<void_(ODDLParser::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f8,ddl_info_msg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  }
  testing::Message::Message((Message *)&local_f8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
             ,0x96,
             "Expected: myParser.getLogCallback()(ddl_info_msg, \"\") throws an exception of type std::bad_function_call.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_f8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_f8);
  OpenDDLParser::~OpenDDLParser(&myParser);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, setLogCallbackTest) {
    OpenDDLParser myParser;
    EXPECT_EQ(nullptr, myParser.getLogCallback());
    EXPECT_THROW(myParser.getLogCallback()(ddl_info_msg, ""), std::bad_function_call);

    typedef decltype(&OpenDDLParserTest::testLogCallback) cbType;
    myParser.setLogCallback(OpenDDLParserTest::testLogCallback);
    EXPECT_EQ(&OpenDDLParserTest::testLogCallback, *myParser.getLogCallback().target<cbType>());
    EXPECT_NE(nullptr, myParser.getLogCallback());
    EXPECT_TRUE((bool)myParser.getLogCallback());

    myParser.setLogCallback(nullptr);
    EXPECT_EQ(nullptr, myParser.getLogCallback());
    EXPECT_FALSE((bool)myParser.getLogCallback());
    EXPECT_THROW(myParser.getLogCallback()(ddl_info_msg, ""), std::bad_function_call);
}